

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O2

void readLine(filebuf *file,string *buffer)

{
  int iVar1;
  
  while( true ) {
    iVar1 = std::streambuf::sbumpc();
    if (iVar1 == -1) {
      return;
    }
    if (iVar1 == 10) break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (buffer,(char)iVar1);
  }
  if (buffer->_M_string_length == 0) {
    return;
  }
  if ((buffer->_M_dataplus)._M_p[buffer->_M_string_length - 1] != '\r') {
    return;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back(buffer);
  return;
}

Assistant:

static void readLine(std::filebuf &file, std::string &buffer) {
	// TODO: maybe this can be optimized to bulk reads?
	for (;;) {
		auto c = file.sbumpc();
		if (c == std::filebuf::traits_type::eof()) {
			return;
		}
		if (c == '\n') {
			// Discard a trailing CRLF
			if (!buffer.empty() && buffer.back() == '\r') {
				buffer.pop_back();
			}
			return;
		}

		buffer.push_back(c);
	}
}